

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mimeenc.c
# Opt level: O1

int charset_from_mimeenc(char *name)

{
  char *pcVar1;
  bool bVar2;
  long in_RAX;
  __int32_t **pp_Var3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  undefined8 uStack_38;
  
  lVar6 = 0;
  uStack_38 = in_RAX;
  while( true ) {
    pcVar1 = mimeencs[lVar6].name;
    lVar4 = 0;
    while (((uVar5 = (ulong)(byte)name[lVar4], uVar5 != 0 || (pcVar1[lVar4] != '\0')) &&
           (pp_Var3 = __ctype_tolower_loc(), (*pp_Var3)[uVar5] == (*pp_Var3)[(byte)pcVar1[lVar4]])))
    {
      lVar4 = lVar4 + 1;
    }
    bVar2 = true;
    if ((uVar5 == 0) && (pcVar1[lVar4] == '\0')) {
      uStack_38 = (ulong)(uint)mimeencs[lVar6].charset << 0x20;
      bVar2 = false;
    }
    if (!bVar2) break;
    lVar6 = lVar6 + 1;
    if (lVar6 == 0x82) {
      return 0;
    }
  }
  return uStack_38._4_4_;
}

Assistant:

int charset_from_mimeenc(const char *name)
{
    int i;

    for (i = 0; i < (int)lenof(mimeencs); i++) {
        const char *p, *q;
        p = name;
        q = mimeencs[i].name;
        while (*p || *q) {
                if (tolower((unsigned char)*p) != tolower((unsigned char)*q))
                break;
            p++; q++;
        }
        if (!*p && !*q)
            return mimeencs[i].charset;
    }

    return CS_NONE;                    /* not found */
}